

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::resize
          (file_pool_impl<libtorrent::aux::file_view_entry> *this,int size)

{
  size_type sVar1;
  unique_lock<std::mutex> l;
  vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  defer_destruction;
  unique_lock<std::mutex> uStack_68;
  vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  local_58;
  
  local_58.
  super__Vector_base<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::unique_lock<std::mutex>::unique_lock(&uStack_68,&this->m_mutex);
  if (this->m_size != size) {
    this->m_size = size;
    sVar1 = (this->m_files).node_count;
    if (size < (int)sVar1) {
      while (size < (int)sVar1) {
        remove_oldest((file_pool_impl<libtorrent::aux::file_view_entry> *)&stack0xffffffffffffffc0,
                      (unique_lock<std::mutex> *)this);
        ::std::
        vector<std::shared_ptr<libtorrent::aux::file_mapping>,std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>>>
        ::emplace_back<std::shared_ptr<libtorrent::aux::file_mapping>>
                  ((vector<std::shared_ptr<libtorrent::aux::file_mapping>,std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>>>
                    *)&local_58,
                   (shared_ptr<libtorrent::aux::file_mapping> *)&stack0xffffffffffffffc0);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
        sVar1 = (this->m_files).node_count;
        size = this->m_size;
      }
    }
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_68);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void file_pool_impl<FileEntry>::resize(int const size)
	{
		// these are destructed _after_ the mutex is released
		std::vector<FileHandle> defer_destruction;

		std::unique_lock<std::mutex> l(m_mutex);

		TORRENT_ASSERT(size > 0);

		if (size == m_size) return;
		m_size = size;
		if (int(m_files.size()) <= m_size) return;

		// close the least recently used files
		while (int(m_files.size()) > m_size)
			defer_destruction.emplace_back(remove_oldest(l));
	}